

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_parse.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* request_parse(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,string *request)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a_00;
  bool bVar1;
  type m;
  sregex_iterator words_begin;
  sregex_iterator words_end;
  sregex_iterator i;
  regex re;
  smatch a;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_e8;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_d8;
  shared_ptr<boost::regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
  local_c0;
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> local_b0;
  string_type local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            (&local_b0,"(\\w+)",0);
  a_00._M_current = (request->_M_dataplus)._M_p;
  boost::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  ::regex_iterator(&local_e8,a_00,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(a_00._M_current + request->_M_string_length),&local_b0,format_default);
  local_d8.pdata.px = (element_type *)0x0;
  local_d8.pdata.pn.pi_ = (sp_counted_base *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.px = local_e8.pdata.px;
  local_c0.pn.pi_ = local_e8.pdata.pn.pi_;
  if (local_e8.pdata.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_e8.pdata.pn.pi_)->use_count_ = (local_e8.pdata.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  while( true ) {
    bVar1 = boost::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
            ::operator!=((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)&local_c0,&local_d8);
    if (!bVar1) break;
    m = boost::
        shared_ptr<boost::regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
        ::operator->(&local_c0);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results(&local_80,&m->what);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_a0,&local_80,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_80);
    boost::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
    ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                  *)&local_c0);
  }
  boost::detail::shared_count::~shared_count(&local_c0.pn);
  boost::detail::shared_count::~shared_count(&local_d8.pdata.pn);
  boost::detail::shared_count::~shared_count(&local_e8.pdata.pn);
  boost::detail::shared_count::~shared_count(&local_b0.m_pimpl.pn);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> request_parse(std::string request){

    boost::regex re("(\\w+)");
    boost::sregex_iterator words_begin = boost::sregex_iterator(
        request.begin(), request.end(), re);
    boost::sregex_iterator words_end = boost::sregex_iterator();

    //boost::smatch sm;
    std::vector<std::string> result;
    for(boost::sregex_iterator i = words_begin;i!=words_end;++i){
        boost::smatch a = *i;
        result.push_back(a.str());
    }
    return result;

}